

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ciphers.c
# Opt level: O2

void warn_if_untested(EVP_CIPHER *ciph,void *provider)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  testcase *ptVar4;
  
  pvVar2 = (void *)EVP_CIPHER_get0_provider();
  if (pvVar2 == provider) {
    ptVar4 = testcases;
    do {
      if (ptVar4->algname == (char *)0x0) {
        uVar3 = EVP_CIPHER_get0_name(ciph);
        printf("\x1b[1;35mCipher %s is untested!\x1b[m\n",uVar3);
        return;
      }
      iVar1 = EVP_CIPHER_is_a(ciph);
      ptVar4 = ptVar4 + 1;
    } while (iVar1 == 0);
  }
  return;
}

Assistant:

void warn_if_untested(const EVP_CIPHER *ciph, void *provider)
{
    const struct testcase *t;

    /* ENGINE provided EVP_MDs have a NULL provider */
    if (provider != EVP_CIPHER_get0_provider(ciph))
        return;

    for (t = testcases; t->algname; t++)
        if (EVP_CIPHER_is_a(ciph, t->algname))
            break;
    if (!t->algname)
        printf(cMAGENT "Cipher %s is untested!" cNORM "\n", EVP_CIPHER_name(ciph));
}